

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_tools.cpp
# Opt level: O1

void dlib::tt::dot_prods(bool add_to,tensor *out,tensor *lhs,tensor *rhs)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 in_register_00000039;
  undefined8 local_78;
  ulong uStack_70;
  ulong uStack_68;
  ulong uStack_60;
  undefined8 local_58;
  ulong uStack_50;
  ulong uStack_48;
  ulong uStack_40;
  undefined8 **local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  
  if ((int)CONCAT71(in_register_00000039,add_to) == 0) {
    uVar1 = lhs->m_size;
    if (uVar1 == 0) {
      local_58 = 0;
      uStack_50 = 0;
      uStack_40 = 0;
    }
    else {
      uVar2 = lhs->m_n;
      iVar3 = (*lhs->_vptr_tensor[2])(lhs,lhs->_vptr_tensor,uVar1 % uVar2);
      local_58 = CONCAT44(extraout_var_00,iVar3);
      uStack_50 = uVar2;
      uStack_40 = uVar1 / uVar2;
    }
    uVar1 = rhs->m_size;
    uStack_48 = uStack_40;
    if (uVar1 == 0) {
      local_78 = 0;
      uStack_70 = 0;
      uStack_60 = 0;
    }
    else {
      uVar2 = rhs->m_n;
      iVar3 = (*rhs->_vptr_tensor[2])(rhs);
      local_78 = CONCAT44(extraout_var_02,iVar3);
      uStack_70 = uVar2;
      uStack_60 = uVar1 / uVar2;
    }
    local_30 = &local_58;
    local_38 = &local_30;
    uStack_68 = uStack_60;
    local_28 = (undefined1 *)&local_78;
    tensor::operator=(out,(matrix_exp<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
                           *)&local_38);
  }
  else {
    uVar1 = lhs->m_size;
    if (uVar1 == 0) {
      local_58 = 0;
      uStack_50 = 0;
      uStack_40 = 0;
    }
    else {
      uVar2 = lhs->m_n;
      iVar3 = (*lhs->_vptr_tensor[2])(lhs,lhs->_vptr_tensor,uVar1 % uVar2);
      local_58 = CONCAT44(extraout_var,iVar3);
      uStack_50 = uVar2;
      uStack_40 = uVar1 / uVar2;
    }
    uVar1 = rhs->m_size;
    uStack_48 = uStack_40;
    if (uVar1 == 0) {
      local_78 = 0;
      uStack_70 = 0;
      uStack_60 = 0;
    }
    else {
      uVar2 = rhs->m_n;
      iVar3 = (*rhs->_vptr_tensor[2])(rhs);
      local_78 = CONCAT44(extraout_var_01,iVar3);
      uStack_70 = uVar2;
      uStack_60 = uVar1 / uVar2;
    }
    local_30 = &local_58;
    local_38 = &local_30;
    uStack_68 = uStack_60;
    local_28 = (undefined1 *)&local_78;
    tensor::operator+=(out,(matrix_exp<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
                            *)&local_38);
  }
  return;
}

Assistant:

void dot_prods (
        bool add_to,
        tensor& out,
        const tensor& lhs,
        const tensor& rhs
    )
    {
#ifdef DLIB_USE_CUDA
        cuda::dot_prods(add_to, out, lhs, rhs);
#else
        if (add_to)
            out += sum_cols(pointwise_multiply(mat(lhs), mat(rhs))); 
        else
            out = sum_cols(pointwise_multiply(mat(lhs), mat(rhs))); 
#endif
    }